

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::setFlag(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *this,ConfigData *obj)

{
  string local_38 [8];
  type value;
  ConfigData *obj_local;
  BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  std::__cxx11::string::string(local_38);
  convertInto<std::__cxx11::string>
            (true,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  (*this->function)(obj,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void setFlag( C& obj ) const {
                typename RemoveConstRef<T>::type value;
                convertInto( true, value );
                function( obj, value );
            }